

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
llbuild::core::TaskInterface::complete(TaskInterface *this,ValueType *value,bool forceChange)

{
  pointer *pppTVar1;
  Result *__y;
  BuildEngineImpl *this_00;
  RuleInfo *this_01;
  _Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
  *p_Var2;
  BuildEngineDelegate *pBVar3;
  _Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
  *this_02;
  bool bVar4;
  TaskInfo *pTVar5;
  TaskInfo *pTVar6;
  ulong uVar7;
  pointer __dest;
  allocator_type *__a;
  Result *__n;
  ulong uVar8;
  size_t __n_00;
  Twine local_48;
  
  this_00 = (BuildEngineImpl *)this->impl;
  pTVar5 = anon_unknown.dwarf_14a672::BuildEngineImpl::getTaskInfo(this_00,(Task *)this->ctx);
  if (pTVar5 == (TaskInfo *)0x0) {
    __assert_fail("taskInfo && \"cannot request inputs for an unknown task\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x70a,
                  "void (anonymous namespace)::BuildEngineImpl::taskIsComplete(Task *, ValueType &&, bool)"
                 );
  }
  this_01 = pTVar5->forRuleInfo;
  if (this_01->state != InProgressComputing) {
    pBVar3 = this_00->delegate;
    llvm::Twine::Twine(&local_48,"invalid state for marking task complete");
    (*pBVar3->_vptr_BuildEngineDelegate[7])(pBVar3,&local_48);
    LOCK();
    (this_00->buildCancelled)._M_base._M_i = true;
    UNLOCK();
    return;
  }
  pTVar6 = anon_unknown.dwarf_14a672::BuildEngineImpl::RuleInfo::getPendingTaskInfo(this_01);
  if (pTVar5 != pTVar6) {
    __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x713,
                  "void (anonymous namespace)::BuildEngineImpl::taskIsComplete(Task *, ValueType &&, bool)"
                 );
  }
  __y = &this_01->result;
  (this_01->result).signature.value =
       (((this_01->rule)._M_t.
         super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>._M_t.
         super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
         super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl)->signature).value;
  if (!forceChange) {
    __n = __y;
    bVar4 = std::operator==(value,&__y->value);
    if (bVar4) goto LAB_00145aea;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&__y->value);
  (this_01->result).computedAt = this_00->currentEpoch;
  __n = (Result *)value;
LAB_00145aea:
  std::mutex::lock(&this_00->finishedTaskInfosMutex);
  p_Var2 = (_Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
            *)(this_00->finishedTaskInfos).
              super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var2 == (_Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                 *)(this_00->finishedTaskInfos).
                   super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_02 = (_Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
               *)(this_00->finishedTaskInfos).
                 super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    __n_00 = (long)p_Var2 - (long)this_02;
    if (__n_00 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = (long)__n_00 >> 3;
    uVar7 = 1;
    if (p_Var2 != this_02) {
      uVar7 = uVar8;
    }
    __a = (allocator_type *)(uVar7 + uVar8);
    if ((allocator_type *)0xffffffffffffffe < __a) {
      __a = (allocator_type *)0xfffffffffffffff;
    }
    if (CARRY8(uVar7,uVar8)) {
      __a = (allocator_type *)0xfffffffffffffff;
    }
    if (__a == (allocator_type *)0x0) {
      __dest = (pointer)0x0;
    }
    else {
      __dest = std::
               allocator_traits<std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
               ::allocate(__a,(size_type)__n);
    }
    __dest[uVar8] = pTVar5;
    if (0 < (long)__n_00) {
      memmove(__dest,this_02,__n_00);
    }
    std::
    _Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ::_M_deallocate(this_02,(pointer)((long)(this_00->finishedTaskInfos).
                                            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_02 >> 3),(size_t)this_02);
    (this_00->finishedTaskInfos).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = __dest;
    (this_00->finishedTaskInfos).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n_00 + 8);
    (this_00->finishedTaskInfos).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + (long)__a;
  }
  else {
    (p_Var2->_M_impl).super__Vector_impl_data._M_start = (pointer)pTVar5;
    pppTVar1 = &(this_00->finishedTaskInfos).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->finishedTaskInfosMutex);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void TaskInterface::complete(ValueType &&value, bool forceChange) {
  Task* task = static_cast<Task*>(ctx);
  static_cast<BuildEngineImpl*>(impl)->taskIsComplete(task, std::move(value),
                                                      forceChange);
}